

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_Reset_Test::TestBody(TApp_Reset_Test *this)

{
  App *this_00;
  long lVar1;
  char *pcVar2;
  allocator local_1e1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  AssertHelper local_1d8;
  double doub;
  AssertionResult gtest_ar;
  string local_1a8 [32];
  string local_188 [32];
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"--simple",(allocator *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_68,"",(allocator *)&doub);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_flag(this_00,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_88,"-d,--double",(allocator *)&gtest_ar);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_1e0);
  CLI::App::add_option<double,_(CLI::detail::enabler)0>(this_00,&local_88,&doub,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&gtest_ar,"--simple",(allocator *)&local_1e0);
  std::__cxx11::string::string(local_1a8,"--double",(allocator *)&local_1d8);
  std::__cxx11::string::string(local_188,"1.2",&local_1e1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&gtest_ar,&local_168);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  TApp::run(&this->super_TApp);
  local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::string((string *)&local_c8,"--simple",&local_1e1);
  local_1d8.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_c8);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)1","app.count(\"--simple\")",(unsigned_long *)&local_1e0
             ,(unsigned_long *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2d0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::string((string *)&local_e8,"-d",&local_1e1);
  local_1d8.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_e8);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)1","app.count(\"-d\")",(unsigned_long *)&local_1e0,
             (unsigned_long *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2d1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>((internal *)&gtest_ar,"1.2","doub",1.2,doub);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2d2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::reset(this_00);
  local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__cxx11::string::string((string *)&local_108,"--simple",&local_1e1);
  local_1d8.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_108);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)0","app.count(\"--simple\")",(unsigned_long *)&local_1e0
             ,(unsigned_long *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2d6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__cxx11::string::string((string *)&local_128,"-d",&local_1e1);
  local_1d8.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_128);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)0","app.count(\"-d\")",(unsigned_long *)&local_1e0,
             (unsigned_long *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_128);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2d7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  TApp::run(&this->super_TApp);
  local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::string((string *)&local_148,"--simple",&local_1e1);
  local_1d8.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_148);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)1","app.count(\"--simple\")",(unsigned_long *)&local_1e0
             ,(unsigned_long *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2db,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_1e0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  std::__cxx11::string::string((string *)&local_168,"-d",&local_1e1);
  local_1d8.data_ = (AssertHelperData *)CLI::App::count(this_00,&local_168);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"(size_t)1","app.count(\"-d\")",(unsigned_long *)&local_1e0,
             (unsigned_long *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_168);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2dc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>((internal *)&gtest_ar,"1.2","doub",1.2,doub);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x2dd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(TApp, Reset) {

    app.add_flag("--simple");
    double doub;
    app.add_option("-d,--double", doub);

    args = {"--simple", "--double", "1.2"};

    run();

    EXPECT_EQ((size_t)1, app.count("--simple"));
    EXPECT_EQ((size_t)1, app.count("-d"));
    EXPECT_DOUBLE_EQ(1.2, doub);

    app.reset();

    EXPECT_EQ((size_t)0, app.count("--simple"));
    EXPECT_EQ((size_t)0, app.count("-d"));

    run();

    EXPECT_EQ((size_t)1, app.count("--simple"));
    EXPECT_EQ((size_t)1, app.count("-d"));
    EXPECT_DOUBLE_EQ(1.2, doub);
}